

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O3

void __thiscall dg::pta::PointerAnalysis::initialize_queue(PointerAnalysis *this)

{
  pointer ppPVar1;
  pointer ppPVar2;
  PSNode *root;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> local_38;
  PSNode *local_18;
  
  local_18 = *(PSNode **)(this->PG->_entry + 0x58);
  PointerGraph::getNodes<dg::pta::PSNode*>(&local_38,this->PG,&local_18,true,0);
  ppPVar1 = (this->to_process).
            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppPVar2 = (this->to_process).
            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (this->to_process).super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_38.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->to_process).super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_38.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->to_process).super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_38.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_38.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (ppPVar1 != (pointer)0x0) {
    operator_delete(ppPVar1,(long)ppPVar2 - (long)ppPVar1);
    if (local_38.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.
                      super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_38.
                            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.
                            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void initialize_queue() {
        assert(to_process.empty());

        PSNode *root = PG->getEntry()->getRoot();
        assert(root && "Do not have root of PG");
        // rely on C++11 move semantics
        to_process = PG->getNodes(root);
    }